

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

char * soplex::LPFgetRowName<double>
                 (SPxLPBase<double> *p_lp,int p_idx,NameSet *p_rnames,char *p_buf,
                 int p_num_written_rows)

{
  Item *pIVar1;
  DataKey local_30;
  SPxRowId local_28;
  
  if (p_rnames != (NameSet *)0x0) {
    local_30 = (p_lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[p_idx];
    SPxRowId::SPxRowId(&local_28,&local_30);
    pIVar1 = (p_rnames->set).theitem;
    if (-1 < pIVar1[local_28.super_DataKey.idx].info) {
      return p_rnames->mem + pIVar1[local_28.super_DataKey.idx].data;
    }
  }
  spxSnprintf(p_buf,0x10,"C%d",(ulong)(uint)p_num_written_rows);
  return p_buf;
}

Assistant:

static const char* LPFgetRowName(
   const SPxLPBase<R>& p_lp,
   int                    p_idx,
   const NameSet*         p_rnames,
   char*                  p_buf,
   int                    p_num_written_rows
)
{
   assert(p_buf != nullptr);
   assert(p_idx >= 0);
   assert(p_idx <  p_lp.nRows());

   if(p_rnames != nullptr)
   {
      DataKey key = p_lp.rId(p_idx);

      if(p_rnames->has(key))
         return (*p_rnames)[key];
   }

   spxSnprintf(p_buf, 16, "C%d", p_num_written_rows);

   return p_buf;
}